

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util_lite.cc
# Opt level: O1

void google::protobuf::TestUtilLite::ExpectAllFieldsSet(TestAllTypesLite *message)

{
  RepeatedField<int> *this;
  RepeatedField<long> *this_00;
  RepeatedField<unsigned_int> *this_01;
  ulong uVar1;
  internal iVar2;
  byte bVar3;
  uint uVar4;
  undefined1 *puVar5;
  const_reference piVar6;
  const_reference plVar7;
  const_reference puVar8;
  const_reference puVar9;
  const_reference pfVar10;
  const_reference pdVar11;
  const_reference pbVar12;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar13;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite_RepeatedGroup>_>
  *pVVar14;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite_NestedMessage>_>
  *pVVar15;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::ForeignMessageLite>_>
  *pVVar16;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessageLite>_>
  *pVVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  char *pcVar19;
  char *in_R9;
  pointer *__ptr;
  bool bVar20;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_110;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  undefined1 local_f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  AssertHelper local_d8;
  RepeatedField<int> *local_d0;
  RepeatedField<int> *local_c8;
  RepeatedField<int> *local_c0;
  RepeatedField<bool> *local_b8;
  RepeatedField<double> *local_b0;
  RepeatedField<float> *local_a8;
  RepeatedField<long> *local_a0;
  RepeatedField<int> *local_98;
  RepeatedField<unsigned_long> *local_90;
  RepeatedField<unsigned_int> *local_88;
  RepeatedField<long> *local_80;
  RepeatedField<int> *local_78;
  RepeatedField<unsigned_long> *local_70;
  RepeatedPtrFieldBase *local_68;
  RepeatedPtrFieldBase *local_60;
  RepeatedPtrFieldBase *local_58;
  RepeatedPtrFieldBase *local_50;
  RepeatedPtrFieldBase *local_48;
  RepeatedPtrFieldBase *local_40;
  RepeatedPtrFieldBase *local_38;
  
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x1000;
  local_108._M_head_impl._0_1_ = (char)(uVar4 >> 0xc);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)"message.has_optional_int32()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xac,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x800;
  local_108._M_head_impl._0_1_ = (char)(uVar4 >> 0xb);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)"message.has_optional_int64()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xad,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x2000;
  local_108._M_head_impl._0_1_ = (char)(uVar4 >> 0xd);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)"message.has_optional_uint32()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xae,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x4000;
  local_108._M_head_impl._0_1_ = (char)(uVar4 >> 0xe);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)"message.has_optional_uint64()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xaf,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x10000;
  local_108._M_head_impl._0_1_ = (char)(uVar4 >> 0x10);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)"message.has_optional_sint32()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xb0,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x8000;
  local_108._M_head_impl._0_1_ = (char)(uVar4 >> 0xf);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)"message.has_optional_sint64()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xb1,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x20000;
  local_108._M_head_impl._0_1_ = (char)(uVar4 >> 0x11);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)"message.has_optional_fixed32()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xb2,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x40000;
  local_108._M_head_impl._0_1_ = (char)(uVar4 >> 0x12);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)"message.has_optional_fixed64()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xb3,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x100000;
  local_108._M_head_impl._0_1_ = (char)(uVar4 >> 0x14);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)"message.has_optional_sfixed32()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xb4,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x80000;
  local_108._M_head_impl._0_1_ = (char)(uVar4 >> 0x13);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)"message.has_optional_sfixed64()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xb5,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x200000;
  local_108._M_head_impl._0_1_ = (char)(uVar4 >> 0x15);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)"message.has_optional_float()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xb6,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x400000;
  local_108._M_head_impl._0_1_ = (char)(uVar4 >> 0x16);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)"message.has_optional_double()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xb7,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x800000;
  local_108._M_head_impl._0_1_ = (char)(uVar4 >> 0x17);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)"message.has_optional_bool()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xb8,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  local_108._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (CONCAT71(local_108._M_head_impl._1_7_,*(byte *)&message->field_0) & 0xffffffffffffff01);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((*(byte *)&message->field_0 & 1) == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)"message.has_optional_string()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xb9,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 2;
  local_108._M_head_impl._0_1_ = (char)(uVar4 >> 1);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)"message.has_optional_bytes()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xba,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x10;
  if ((uVar4 != 0) &&
     ((message->field_0)._impl_.optionalgroup_ == (TestAllTypesLite_OptionalGroup *)0x0)) {
    internal::protobuf_assumption_failed
              ("!value || _impl_.optionalgroup_ != nullptr",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/unittest_lite.pb.h"
               ,0x2bdd);
  }
  local_108._M_head_impl._0_1_ = (char)(uVar4 >> 4);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)"message.has_optionalgroup()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xbc,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x20;
  if ((uVar4 != 0) &&
     ((message->field_0)._impl_.optional_nested_message_ == (TestAllTypesLite_NestedMessage *)0x0))
  {
    internal::protobuf_assumption_failed
              ("!value || _impl_.optional_nested_message_ != nullptr",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/unittest_lite.pb.h"
               ,0x2c3f);
  }
  local_108._M_head_impl._0_1_ = (char)(uVar4 >> 5);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)"message.has_optional_nested_message()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xbd,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x40;
  if ((uVar4 != 0) &&
     ((message->field_0)._impl_.optional_foreign_message_ == (ForeignMessageLite *)0x0)) {
    internal::protobuf_assumption_failed
              ("!value || _impl_.optional_foreign_message_ != nullptr",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/unittest_lite.pb.h"
               ,0x2ca1);
  }
  local_108._M_head_impl._0_1_ = (char)(uVar4 >> 6);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)"message.has_optional_foreign_message()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xbe,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  bVar3 = (byte)(message->field_0)._impl_._has_bits_.has_bits_[0];
  if (((char)bVar3 < '\0') &&
     ((message->field_0)._impl_.optional_import_message_ == (ImportMessageLite *)0x0)) {
    internal::protobuf_assumption_failed
              ("!value || _impl_.optional_import_message_ != nullptr",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/unittest_lite.pb.h"
               ,0x2d03);
  }
  local_108._M_head_impl._0_1_ = bVar3 >> 7;
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (-1 < (char)bVar3) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)"message.has_optional_import_message()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xbf,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x100;
  if ((uVar4 != 0) &&
     ((message->field_0)._impl_.optional_public_import_message_ == (PublicImportMessageLite *)0x0))
  {
    internal::protobuf_assumption_failed
              ("!value || _impl_.optional_public_import_message_ != nullptr",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/unittest_lite.pb.h"
               ,0x2e6d);
  }
  local_108._M_head_impl._0_1_ = (char)(uVar4 >> 8);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)"message.has_optional_public_import_message()","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xc0,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x200;
  if ((uVar4 != 0) &&
     ((message->field_0)._impl_.optional_lazy_message_ == (TestAllTypesLite_NestedMessage *)0x0)) {
    internal::protobuf_assumption_failed
              ("!value || _impl_.optional_lazy_message_ != nullptr",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/unittest_lite.pb.h"
               ,0x2eca);
  }
  local_108._M_head_impl._0_1_ = (char)(uVar4 >> 9);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)"message.has_optional_lazy_message()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xc1,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x400;
  if ((uVar4 != 0) &&
     ((message->field_0)._impl_.optional_unverified_lazy_message_ ==
      (TestAllTypesLite_NestedMessage *)0x0)) {
    internal::protobuf_assumption_failed
              ("!value || _impl_.optional_unverified_lazy_message_ != nullptr",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/unittest_lite.pb.h"
               ,0x2f2c);
  }
  local_108._M_head_impl._0_1_ = (char)(uVar4 >> 10);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)"message.has_optional_unverified_lazy_message()","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xc2,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  puVar5 = (undefined1 *)(message->field_0)._impl_.optionalgroup_;
  if ((TestAllTypesLite_OptionalGroup *)puVar5 == (TestAllTypesLite_OptionalGroup *)0x0) {
    puVar5 = proto2_unittest::_TestAllTypesLite_OptionalGroup_default_instance_;
  }
  local_108._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (CONCAT71(local_108._M_head_impl._1_7_,
                 *(byte *)&((TestAllTypesLite_OptionalGroup *)puVar5)->field_0) & 0xffffffffffffff01
       );
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((*(byte *)&((TestAllTypesLite_OptionalGroup *)puVar5)->field_0 & 1) == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)"message.optionalgroup().has_a()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xc4,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  puVar5 = (undefined1 *)(message->field_0)._impl_.optional_nested_message_;
  if ((TestAllTypesLite_NestedMessage *)puVar5 == (TestAllTypesLite_NestedMessage *)0x0) {
    puVar5 = proto2_unittest::_TestAllTypesLite_NestedMessage_default_instance_;
  }
  uVar4 = (((TestAllTypesLite_NestedMessage *)puVar5)->field_0)._impl_._has_bits_.has_bits_[0] & 2;
  local_108._M_head_impl._0_1_ = (char)(uVar4 >> 1);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)"message.optional_nested_message().has_bb()","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xc5,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  puVar5 = (undefined1 *)(message->field_0)._impl_.optional_foreign_message_;
  if ((ForeignMessageLite *)puVar5 == (ForeignMessageLite *)0x0) {
    puVar5 = proto2_unittest::_ForeignMessageLite_default_instance_;
  }
  local_108._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (CONCAT71(local_108._M_head_impl._1_7_,*(byte *)&((ForeignMessageLite *)puVar5)->field_0) &
       0xffffffffffffff01);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((*(byte *)&((ForeignMessageLite *)puVar5)->field_0 & 1) == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)"message.optional_foreign_message().has_c()","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xc6,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  puVar5 = (undefined1 *)(message->field_0)._impl_.optional_import_message_;
  if ((ImportMessageLite *)puVar5 == (ImportMessageLite *)0x0) {
    puVar5 = proto2_unittest_import::_ImportMessageLite_default_instance_;
  }
  local_108._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (CONCAT71(local_108._M_head_impl._1_7_,*(byte *)&((ImportMessageLite *)puVar5)->field_0) &
       0xffffffffffffff01);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((*(byte *)&((ImportMessageLite *)puVar5)->field_0 & 1) == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)"message.optional_import_message().has_d()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,199,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  puVar5 = (undefined1 *)(message->field_0)._impl_.optional_public_import_message_;
  if ((PublicImportMessageLite *)puVar5 == (PublicImportMessageLite *)0x0) {
    puVar5 = proto2_unittest_import::_PublicImportMessageLite_default_instance_;
  }
  local_108._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (CONCAT71(local_108._M_head_impl._1_7_,*(byte *)&((PublicImportMessageLite *)puVar5)->field_0
                ) & 0xffffffffffffff01);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((*(byte *)&((PublicImportMessageLite *)puVar5)->field_0 & 1) == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)"message.optional_public_import_message().has_e()","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,200,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  puVar5 = (undefined1 *)(message->field_0)._impl_.optional_lazy_message_;
  if ((TestAllTypesLite_NestedMessage *)puVar5 == (TestAllTypesLite_NestedMessage *)0x0) {
    puVar5 = proto2_unittest::_TestAllTypesLite_NestedMessage_default_instance_;
  }
  uVar4 = (((TestAllTypesLite_NestedMessage *)puVar5)->field_0)._impl_._has_bits_.has_bits_[0] & 2;
  local_108._M_head_impl._0_1_ = (char)(uVar4 >> 1);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)"message.optional_lazy_message().has_bb()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xc9,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  puVar5 = (undefined1 *)(message->field_0)._impl_.optional_unverified_lazy_message_;
  if ((TestAllTypesLite_NestedMessage *)puVar5 == (TestAllTypesLite_NestedMessage *)0x0) {
    puVar5 = proto2_unittest::_TestAllTypesLite_NestedMessage_default_instance_;
  }
  uVar4 = (((TestAllTypesLite_NestedMessage *)puVar5)->field_0)._impl_._has_bits_.has_bits_[0] & 2;
  local_108._M_head_impl._0_1_ = (char)(uVar4 >> 1);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)"message.optional_unverified_lazy_message().has_bb()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xca,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x2000000;
  local_108._M_head_impl._0_1_ = (byte)(uVar4 >> 0x19);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)"message.has_optional_nested_enum()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xcc,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x4000000;
  local_108._M_head_impl._0_1_ = (byte)(uVar4 >> 0x1a);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)"message.has_optional_foreign_enum()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xcd,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x1000000;
  local_108._M_head_impl._0_1_ = (char)(uVar4 >> 0x18);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)"message.has_optional_import_enum()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xce,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  local_108._M_head_impl._0_4_ = 0x65;
  local_110.data_._0_4_ = (float)(message->field_0)._impl_.optional_int32_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_f8,"101","message.optional_int32()",(int *)&local_108,
             (int *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar19 = "";
    }
    else {
      pcVar19 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xd1,pcVar19);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_110.data_._0_4_ = 1.42932e-43;
  local_108._M_head_impl =
       *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
        ((long)&message->field_0 + 0x240);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_f8,"102","message.optional_int64()",(int *)&local_110,
             (long *)&local_108);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar19 = "";
    }
    else {
      pcVar19 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xd2,pcVar19);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._M_head_impl._0_4_ = 0x67;
  local_110.data_._0_4_ = (float)(message->field_0)._impl_.optional_uint32_;
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_f8,"103","message.optional_uint32()",(int *)&local_108,
             (uint *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar19 = "";
    }
    else {
      pcVar19 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xd3,pcVar19);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_110.data_._0_4_ = 1.45735e-43;
  local_108._M_head_impl =
       *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
        ((long)&message->field_0 + 0x250);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_f8,"104","message.optional_uint64()",(int *)&local_110,
             (unsigned_long *)&local_108);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar19 = "";
    }
    else {
      pcVar19 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xd4,pcVar19);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._M_head_impl._0_4_ = 0x69;
  local_110.data_._0_4_ = (float)(message->field_0)._impl_.optional_sint32_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_f8,"105","message.optional_sint32()",(int *)&local_108,
             (int *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar19 = "";
    }
    else {
      pcVar19 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xd5,pcVar19);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_110.data_._0_4_ = 1.48538e-43;
  local_108._M_head_impl =
       *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
        ((long)&message->field_0 + 600);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_f8,"106","message.optional_sint64()",(int *)&local_110,
             (long *)&local_108);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar19 = "";
    }
    else {
      pcVar19 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xd6,pcVar19);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._M_head_impl._0_4_ = 0x6b;
  local_110.data_._0_4_ = (float)(message->field_0)._impl_.optional_fixed32_;
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_f8,"107","message.optional_fixed32()",(int *)&local_108,
             (uint *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar19 = "";
    }
    else {
      pcVar19 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xd7,pcVar19);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_110.data_._0_4_ = 1.5134e-43;
  local_108._M_head_impl =
       *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
        ((long)&message->field_0 + 0x268);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_f8,"108","message.optional_fixed64()",(int *)&local_110,
             (unsigned_long *)&local_108);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar19 = "";
    }
    else {
      pcVar19 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xd8,pcVar19);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._M_head_impl._0_4_ = 0x6d;
  local_110.data_._0_4_ = (float)(message->field_0)._impl_.optional_sfixed32_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_f8,"109","message.optional_sfixed32()",(int *)&local_108,
             (int *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar19 = "";
    }
    else {
      pcVar19 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xd9,pcVar19);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_110.data_._0_4_ = 1.54143e-43;
  local_108._M_head_impl =
       *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
        ((long)&message->field_0 + 0x270);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_f8,"110","message.optional_sfixed64()",(int *)&local_110,
             (long *)&local_108);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar19 = "";
    }
    else {
      pcVar19 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xda,pcVar19);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._M_head_impl._0_4_ = 0x6f;
  local_110.data_._0_4_ = (message->field_0)._impl_.optional_float_;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)local_f8,"111","message.optional_float()",(int *)&local_108,
             (float *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar19 = "";
    }
    else {
      pcVar19 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xdb,pcVar19);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_110.data_._0_4_ = 1.56945e-43;
  local_108._M_head_impl =
       *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
        ((long)&message->field_0 + 0x280);
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)local_f8,"112","message.optional_double()",(int *)&local_110,
             (double *)&local_108);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar19 = "";
    }
    else {
      pcVar19 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xdc,pcVar19);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._M_head_impl._0_1_ = 1;
  local_110.data_._0_4_ =
       (float)CONCAT31(local_110.data_._1_3_,(message->field_0)._impl_.optional_bool_);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_f8,"true","message.optional_bool()",(bool *)&local_108,
             (bool *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar19 = "";
    }
    else {
      pcVar19 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xdd,pcVar19);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)local_f8,"\"115\"","message.optional_string()",(char (*) [4])"115",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)(message->field_0)._impl_.optional_string_.tagged_ptr_.ptr_ &
             0xfffffffffffffffc));
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar19 = "";
    }
    else {
      pcVar19 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xde,pcVar19);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)local_f8,"\"116\"","message.optional_bytes()",(char (*) [4])"116",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)(message->field_0)._impl_.optional_bytes_.tagged_ptr_.ptr_ & 0xfffffffffffffffc
             ));
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar19 = "";
    }
    else {
      pcVar19 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xdf,pcVar19);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._M_head_impl._0_4_ = 0x75;
  puVar5 = (undefined1 *)(message->field_0)._impl_.optionalgroup_;
  if ((TestAllTypesLite_OptionalGroup *)puVar5 == (TestAllTypesLite_OptionalGroup *)0x0) {
    puVar5 = proto2_unittest::_TestAllTypesLite_OptionalGroup_default_instance_;
  }
  local_110.data_._0_4_ = (float)(((TestAllTypesLite_OptionalGroup *)puVar5)->field_0)._impl_.a_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_f8,"117","message.optionalgroup().a()",(int *)&local_108,
             (int *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar19 = "";
    }
    else {
      pcVar19 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xe1,pcVar19);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._M_head_impl._0_4_ = 0x76;
  puVar5 = (undefined1 *)(message->field_0)._impl_.optional_nested_message_;
  if ((TestAllTypesLite_NestedMessage *)puVar5 == (TestAllTypesLite_NestedMessage *)0x0) {
    puVar5 = proto2_unittest::_TestAllTypesLite_NestedMessage_default_instance_;
  }
  local_110.data_._0_4_ = (float)(((TestAllTypesLite_NestedMessage *)puVar5)->field_0)._impl_.bb_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_f8,"118","message.optional_nested_message().bb()",(int *)&local_108,
             (int *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar19 = "";
    }
    else {
      pcVar19 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xe2,pcVar19);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._M_head_impl._0_4_ = 0x77;
  puVar5 = (undefined1 *)(message->field_0)._impl_.optional_foreign_message_;
  if ((ForeignMessageLite *)puVar5 == (ForeignMessageLite *)0x0) {
    puVar5 = proto2_unittest::_ForeignMessageLite_default_instance_;
  }
  local_110.data_._0_4_ = (float)(((ForeignMessageLite *)puVar5)->field_0)._impl_.c_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_f8,"119","message.optional_foreign_message().c()",(int *)&local_108,
             (int *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar19 = "";
    }
    else {
      pcVar19 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xe3,pcVar19);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._M_head_impl._0_4_ = 0x78;
  puVar5 = (undefined1 *)(message->field_0)._impl_.optional_import_message_;
  if ((ImportMessageLite *)puVar5 == (ImportMessageLite *)0x0) {
    puVar5 = proto2_unittest_import::_ImportMessageLite_default_instance_;
  }
  local_110.data_._0_4_ = (float)(((ImportMessageLite *)puVar5)->field_0)._impl_.d_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_f8,"120","message.optional_import_message().d()",(int *)&local_108,
             (int *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar19 = "";
    }
    else {
      pcVar19 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xe4,pcVar19);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._M_head_impl._0_4_ = 0x7e;
  puVar5 = (undefined1 *)(message->field_0)._impl_.optional_public_import_message_;
  if ((PublicImportMessageLite *)puVar5 == (PublicImportMessageLite *)0x0) {
    puVar5 = proto2_unittest_import::_PublicImportMessageLite_default_instance_;
  }
  local_110.data_._0_4_ = (float)(((PublicImportMessageLite *)puVar5)->field_0)._impl_.e_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_f8,"126","message.optional_public_import_message().e()",
             (int *)&local_108,(int *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar19 = "";
    }
    else {
      pcVar19 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xe5,pcVar19);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._M_head_impl._0_4_ = 0x7f;
  puVar5 = (undefined1 *)(message->field_0)._impl_.optional_lazy_message_;
  if ((TestAllTypesLite_NestedMessage *)puVar5 == (TestAllTypesLite_NestedMessage *)0x0) {
    puVar5 = proto2_unittest::_TestAllTypesLite_NestedMessage_default_instance_;
  }
  local_110.data_._0_4_ = (float)(((TestAllTypesLite_NestedMessage *)puVar5)->field_0)._impl_.bb_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_f8,"127","message.optional_lazy_message().bb()",(int *)&local_108,
             (int *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar19 = "";
    }
    else {
      pcVar19 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xe6,pcVar19);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._M_head_impl._0_4_ = 0x80;
  puVar5 = (undefined1 *)(message->field_0)._impl_.optional_unverified_lazy_message_;
  if ((TestAllTypesLite_NestedMessage *)puVar5 == (TestAllTypesLite_NestedMessage *)0x0) {
    puVar5 = proto2_unittest::_TestAllTypesLite_NestedMessage_default_instance_;
  }
  local_110.data_._0_4_ = (float)(((TestAllTypesLite_NestedMessage *)puVar5)->field_0)._impl_.bb_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_f8,"128","message.optional_unverified_lazy_message().bb()",
             (int *)&local_108,(int *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar19 = "";
    }
    else {
      pcVar19 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xe7,pcVar19);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._M_head_impl._0_4_ = (message->field_0)._impl_.optional_nested_enum_;
  testing::internal::
  CmpHelperEQ<proto2_unittest::TestAllTypesLite_NestedEnum,proto2_unittest::TestAllTypesLite_NestedEnum>
            ((internal *)local_f8,"unittest::TestAllTypesLite::BAZ","message.optional_nested_enum()"
             ,&proto2_unittest::TestAllTypesLite::BAZ,(TestAllTypesLite_NestedEnum *)&local_108);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar19 = "";
    }
    else {
      pcVar19 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xe9,pcVar19);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._M_head_impl._0_4_ = 6;
  local_110.data_._0_4_ = (float)(message->field_0)._impl_.optional_foreign_enum_;
  testing::internal::CmpHelperEQ<proto2_unittest::ForeignEnumLite,proto2_unittest::ForeignEnumLite>
            ((internal *)local_f8,"unittest::FOREIGN_LITE_BAZ","message.optional_foreign_enum()",
             (ForeignEnumLite *)&local_108,(ForeignEnumLite *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar19 = "";
    }
    else {
      pcVar19 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xea,pcVar19);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._M_head_impl._0_4_ = 9;
  local_110.data_._0_4_ = (float)(message->field_0)._impl_.optional_import_enum_;
  testing::internal::
  CmpHelperEQ<proto2_unittest_import::ImportEnumLite,proto2_unittest_import::ImportEnumLite>
            ((internal *)local_f8,"unittest_import::IMPORT_LITE_BAZ",
             "message.optional_import_enum()",(ImportEnumLite *)&local_108,
             (ImportEnumLite *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar19 = "";
    }
    else {
      pcVar19 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xeb,pcVar19);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._M_head_impl._0_4_ = 2;
  this = &(message->field_0)._impl_.repeated_int32_;
  local_110.data_._0_4_ =
       (float)internal::SooRep::size
                        (&this->soo_rep_,
                         (undefined1  [824])
                         ((undefined1  [824])message->field_0 & (undefined1  [824])0x4) ==
                         (undefined1  [824])0x0);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_f8,"2","message.repeated_int32_size()",(int *)&local_108,
             (int *)&local_110);
  iVar2 = local_f8[0];
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar19 = "";
    }
    else {
      pcVar19 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xf0,pcVar19);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  if (iVar2 != (internal)0x0) {
    local_108._M_head_impl._0_4_ = 2;
    this_00 = &(message->field_0)._impl_.repeated_int64_;
    local_110.data_._0_4_ =
         (float)internal::SooRep::size
                          (&this_00->soo_rep_,(*(byte *)((long)&message->field_0 + 0x20) & 4) == 0);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_f8,"2","message.repeated_int64_size()",(int *)&local_108,
               (int *)&local_110);
    iVar2 = local_f8[0];
    if (local_f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_108);
      if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar19 = "";
      }
      else {
        pcVar19 = (local_f0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_110,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                 ,0xf1,pcVar19);
      testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper(&local_110);
      if (local_108._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_108._M_head_impl + 8))();
      }
    }
    if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f0,local_f0);
    }
    if (iVar2 != (internal)0x0) {
      local_108._M_head_impl._0_4_ = 2;
      this_01 = &(message->field_0)._impl_.repeated_uint32_;
      local_110.data_._0_4_ =
           (float)internal::SooRep::size
                            (&this_01->soo_rep_,(*(byte *)((long)&message->field_0 + 0x30) & 4) == 0
                            );
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_f8,"2","message.repeated_uint32_size()",(int *)&local_108,
                 (int *)&local_110);
      iVar2 = local_f8[0];
      if (local_f8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_108);
        if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar19 = "";
        }
        else {
          pcVar19 = (local_f0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_110,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                   ,0xf2,pcVar19);
        testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
        testing::internal::AssertHelper::~AssertHelper(&local_110);
        if (local_108._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_108._M_head_impl + 8))();
        }
      }
      if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_f0,local_f0);
      }
      if (iVar2 != (internal)0x0) {
        local_108._M_head_impl._0_4_ = 2;
        local_70 = &(message->field_0)._impl_.repeated_uint64_;
        local_110.data_._0_4_ =
             (float)internal::SooRep::size
                              (&local_70->soo_rep_,
                               (*(byte *)((long)&message->field_0 + 0x40) & 4) == 0);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_f8,"2","message.repeated_uint64_size()",(int *)&local_108,
                   (int *)&local_110);
        iVar2 = local_f8[0];
        if (local_f8[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_108);
          if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar19 = "";
          }
          else {
            pcVar19 = (local_f0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_110,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                     ,0xf3,pcVar19);
          testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
          testing::internal::AssertHelper::~AssertHelper(&local_110);
          if (local_108._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_108._M_head_impl + 8))();
          }
        }
        if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_f0,local_f0);
        }
        if (iVar2 != (internal)0x0) {
          local_108._M_head_impl._0_4_ = 2;
          local_78 = &(message->field_0)._impl_.repeated_sint32_;
          local_110.data_._0_4_ =
               (float)internal::SooRep::size
                                (&local_78->soo_rep_,
                                 (*(byte *)((long)&message->field_0 + 0x50) & 4) == 0);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)local_f8,"2","message.repeated_sint32_size()",(int *)&local_108,
                     (int *)&local_110);
          iVar2 = local_f8[0];
          if (local_f8[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_108);
            if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar19 = "";
            }
            else {
              pcVar19 = (local_f0->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_110,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                       ,0xf4,pcVar19);
            testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
            testing::internal::AssertHelper::~AssertHelper(&local_110);
            if (local_108._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_108._M_head_impl + 8))();
            }
          }
          if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_f0,local_f0);
          }
          if (iVar2 != (internal)0x0) {
            local_108._M_head_impl._0_4_ = 2;
            local_80 = &(message->field_0)._impl_.repeated_sint64_;
            local_110.data_._0_4_ =
                 (float)internal::SooRep::size
                                  (&local_80->soo_rep_,
                                   (*(byte *)((long)&message->field_0 + 0x60) & 4) == 0);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)local_f8,"2","message.repeated_sint64_size()",(int *)&local_108,
                       (int *)&local_110);
            iVar2 = local_f8[0];
            if (local_f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_108);
              if (local_f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = "";
              }
              else {
                pcVar19 = (local_f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_110,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                         ,0xf5,pcVar19);
              testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
              testing::internal::AssertHelper::~AssertHelper(&local_110);
              if (local_108._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_108._M_head_impl + 8))();
              }
            }
            if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_f0,local_f0);
            }
            if (iVar2 != (internal)0x0) {
              local_108._M_head_impl._0_4_ = 2;
              local_88 = &(message->field_0)._impl_.repeated_fixed32_;
              local_110.data_._0_4_ =
                   (float)internal::SooRep::size
                                    (&local_88->soo_rep_,
                                     (*(byte *)((long)&message->field_0 + 0x70) & 4) == 0);
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)local_f8,"2","message.repeated_fixed32_size()",
                         (int *)&local_108,(int *)&local_110);
              iVar2 = local_f8[0];
              if (local_f8[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_108);
                if (local_f0 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar19 = "";
                }
                else {
                  pcVar19 = (local_f0->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_110,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                           ,0xf6,pcVar19);
                testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
                testing::internal::AssertHelper::~AssertHelper(&local_110);
                if (local_108._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_108._M_head_impl + 8))();
                }
              }
              if (local_f0 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_f0,local_f0);
              }
              if (iVar2 != (internal)0x0) {
                local_108._M_head_impl._0_4_ = 2;
                local_90 = &(message->field_0)._impl_.repeated_fixed64_;
                local_110.data_._0_4_ =
                     (float)internal::SooRep::size
                                      (&local_90->soo_rep_,
                                       (*(byte *)((long)&message->field_0 + 0x80) & 4) == 0);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_f8,"2","message.repeated_fixed64_size()",
                           (int *)&local_108,(int *)&local_110);
                iVar2 = local_f8[0];
                if (local_f8[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_108);
                  if (local_f0 ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar19 = "";
                  }
                  else {
                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_110,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                             ,0xf7,pcVar19);
                  testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
                  testing::internal::AssertHelper::~AssertHelper(&local_110);
                  if (local_108._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_108._M_head_impl + 8))();
                  }
                }
                if (local_f0 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_f0,local_f0);
                }
                if (iVar2 != (internal)0x0) {
                  local_108._M_head_impl._0_4_ = 2;
                  local_98 = &(message->field_0)._impl_.repeated_sfixed32_;
                  local_110.data_._0_4_ =
                       (float)internal::SooRep::size
                                        (&local_98->soo_rep_,
                                         (*(byte *)((long)&message->field_0 + 0x90) & 4) == 0);
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)local_f8,"2","message.repeated_sfixed32_size()",
                             (int *)&local_108,(int *)&local_110);
                  iVar2 = local_f8[0];
                  if (local_f8[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_108);
                    if (local_f0 ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar19 = "";
                    }
                    else {
                      pcVar19 = (local_f0->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_110,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                               ,0xf8,pcVar19);
                    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
                    testing::internal::AssertHelper::~AssertHelper(&local_110);
                    if (local_108._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_108._M_head_impl + 8))();
                    }
                  }
                  if (local_f0 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_f0,local_f0);
                  }
                  if (iVar2 != (internal)0x0) {
                    local_108._M_head_impl._0_4_ = 2;
                    local_a0 = &(message->field_0)._impl_.repeated_sfixed64_;
                    local_110.data_._0_4_ =
                         (float)internal::SooRep::size
                                          (&local_a0->soo_rep_,
                                           (*(byte *)((long)&message->field_0 + 0xa0) & 4) == 0);
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)local_f8,"2","message.repeated_sfixed64_size()",
                               (int *)&local_108,(int *)&local_110);
                    iVar2 = local_f8[0];
                    if (local_f8[0] == (internal)0x0) {
                      testing::Message::Message((Message *)&local_108);
                      if (local_f0 ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar19 = "";
                      }
                      else {
                        pcVar19 = (local_f0->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_110,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                 ,0xf9,pcVar19);
                      testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
                      testing::internal::AssertHelper::~AssertHelper(&local_110);
                      if (local_108._M_head_impl !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0) {
                        (**(code **)(*(long *)local_108._M_head_impl + 8))();
                      }
                    }
                    if (local_f0 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_f0,local_f0);
                    }
                    if (iVar2 != (internal)0x0) {
                      local_108._M_head_impl._0_4_ = 2;
                      local_a8 = &(message->field_0)._impl_.repeated_float_;
                      local_110.data_._0_4_ =
                           (float)internal::SooRep::size
                                            (&local_a8->soo_rep_,
                                             (*(byte *)((long)&message->field_0 + 0xb0) & 4) == 0);
                      testing::internal::CmpHelperEQ<int,int>
                                ((internal *)local_f8,"2","message.repeated_float_size()",
                                 (int *)&local_108,(int *)&local_110);
                      iVar2 = local_f8[0];
                      if (local_f8[0] == (internal)0x0) {
                        testing::Message::Message((Message *)&local_108);
                        if (local_f0 ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          pcVar19 = "";
                        }
                        else {
                          pcVar19 = (local_f0->_M_dataplus)._M_p;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_110,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                   ,0xfa,pcVar19);
                        testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108)
                        ;
                        testing::internal::AssertHelper::~AssertHelper(&local_110);
                        if (local_108._M_head_impl !=
                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)0x0) {
                          (**(code **)(*(long *)local_108._M_head_impl + 8))();
                        }
                      }
                      if (local_f0 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_f0,local_f0);
                      }
                      if (iVar2 != (internal)0x0) {
                        local_108._M_head_impl._0_4_ = 2;
                        local_b0 = &(message->field_0)._impl_.repeated_double_;
                        local_110.data_._0_4_ =
                             (float)internal::SooRep::size
                                              (&local_b0->soo_rep_,
                                               (*(byte *)((long)&message->field_0 + 0xc0) & 4) == 0)
                        ;
                        testing::internal::CmpHelperEQ<int,int>
                                  ((internal *)local_f8,"2","message.repeated_double_size()",
                                   (int *)&local_108,(int *)&local_110);
                        iVar2 = local_f8[0];
                        if (local_f8[0] == (internal)0x0) {
                          testing::Message::Message((Message *)&local_108);
                          if (local_f0 ==
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            pcVar19 = "";
                          }
                          else {
                            pcVar19 = (local_f0->_M_dataplus)._M_p;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_110,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                     ,0xfb,pcVar19);
                          testing::internal::AssertHelper::operator=
                                    (&local_110,(Message *)&local_108);
                          testing::internal::AssertHelper::~AssertHelper(&local_110);
                          if (local_108._M_head_impl !=
                              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0) {
                            (**(code **)(*(long *)local_108._M_head_impl + 8))();
                          }
                        }
                        if (local_f0 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&local_f0,local_f0);
                        }
                        if (iVar2 != (internal)0x0) {
                          local_108._M_head_impl._0_4_ = 2;
                          local_b8 = &(message->field_0)._impl_.repeated_bool_;
                          local_110.data_._0_4_ =
                               (float)internal::SooRep::size
                                                (&local_b8->soo_rep_,
                                                 (*(byte *)((long)&message->field_0 + 0xd0) & 4) ==
                                                 0);
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)local_f8,"2","message.repeated_bool_size()",
                                     (int *)&local_108,(int *)&local_110);
                          iVar2 = local_f8[0];
                          if (local_f8[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&local_108);
                            if (local_f0 ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar19 = "";
                            }
                            else {
                              pcVar19 = (local_f0->_M_dataplus)._M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_110,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                       ,0xfc,pcVar19);
                            testing::internal::AssertHelper::operator=
                                      (&local_110,(Message *)&local_108);
                            testing::internal::AssertHelper::~AssertHelper(&local_110);
                            if (local_108._M_head_impl !=
                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                 *)0x0) {
                              (**(code **)(*(long *)local_108._M_head_impl + 8))();
                            }
                          }
                          if (local_f0 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_f0,local_f0);
                          }
                          if (iVar2 != (internal)0x0) {
                            local_108._M_head_impl._0_4_ = 2;
                            local_110.data_._0_4_ = *(float *)((long)&message->field_0 + 0xe8);
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)local_f8,"2","message.repeated_string_size()",
                                       (int *)&local_108,(int *)&local_110);
                            iVar2 = local_f8[0];
                            if (local_f8[0] == (internal)0x0) {
                              testing::Message::Message((Message *)&local_108);
                              if (local_f0 ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pcVar19 = "";
                              }
                              else {
                                pcVar19 = (local_f0->_M_dataplus)._M_p;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_110,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                         ,0xfd,pcVar19);
                              testing::internal::AssertHelper::operator=
                                        (&local_110,(Message *)&local_108);
                              testing::internal::AssertHelper::~AssertHelper(&local_110);
                              if (local_108._M_head_impl !=
                                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                (**(code **)(*(long *)local_108._M_head_impl + 8))();
                              }
                            }
                            if (local_f0 !=
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              std::
                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&local_f0,local_f0);
                            }
                            if (iVar2 != (internal)0x0) {
                              local_108._M_head_impl._0_4_ = 2;
                              local_110.data_._0_4_ = *(float *)((long)&message->field_0 + 0x100);
                              testing::internal::CmpHelperEQ<int,int>
                                        ((internal *)local_f8,"2","message.repeated_bytes_size()",
                                         (int *)&local_108,(int *)&local_110);
                              iVar2 = local_f8[0];
                              if (local_f8[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_108);
                                if (local_f0 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar19 = "";
                                }
                                else {
                                  pcVar19 = (local_f0->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_110,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0xfe,pcVar19);
                                testing::internal::AssertHelper::operator=
                                          (&local_110,(Message *)&local_108);
                                testing::internal::AssertHelper::~AssertHelper(&local_110);
                                if (local_108._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_108._M_head_impl + 8))();
                                }
                              }
                              if (local_f0 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_f0,local_f0);
                              }
                              if (iVar2 != (internal)0x0) {
                                local_108._M_head_impl._0_4_ = 2;
                                local_110.data_._0_4_ = *(float *)((long)&message->field_0 + 0x118);
                                testing::internal::CmpHelperEQ<int,int>
                                          ((internal *)local_f8,"2","message.repeatedgroup_size()",
                                           (int *)&local_108,(int *)&local_110);
                                iVar2 = local_f8[0];
                                if (local_f8[0] == (internal)0x0) {
                                  testing::Message::Message((Message *)&local_108);
                                  if (local_f0 ==
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    pcVar19 = "";
                                  }
                                  else {
                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                  }
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_110,kFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                             ,0x100,pcVar19);
                                  testing::internal::AssertHelper::operator=
                                            (&local_110,(Message *)&local_108);
                                  testing::internal::AssertHelper::~AssertHelper(&local_110);
                                  if (local_108._M_head_impl !=
                                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    (**(code **)(*(long *)local_108._M_head_impl + 8))();
                                  }
                                }
                                if (local_f0 !=
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&local_f0,local_f0);
                                }
                                if (iVar2 != (internal)0x0) {
                                  local_108._M_head_impl._0_4_ = 2;
                                  local_110.data_._0_4_ =
                                       *(float *)((long)&message->field_0 + 0x130);
                                  testing::internal::CmpHelperEQ<int,int>
                                            ((internal *)local_f8,"2",
                                             "message.repeated_nested_message_size()",
                                             (int *)&local_108,(int *)&local_110);
                                  iVar2 = local_f8[0];
                                  if (local_f8[0] == (internal)0x0) {
                                    testing::Message::Message((Message *)&local_108);
                                    if (local_f0 ==
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      pcVar19 = "";
                                    }
                                    else {
                                      pcVar19 = (local_f0->_M_dataplus)._M_p;
                                    }
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_110,kFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                               ,0x101,pcVar19);
                                    testing::internal::AssertHelper::operator=
                                              (&local_110,(Message *)&local_108);
                                    testing::internal::AssertHelper::~AssertHelper(&local_110);
                                    if (local_108._M_head_impl !=
                                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      (**(code **)(*(long *)local_108._M_head_impl + 8))();
                                    }
                                  }
                                  if (local_f0 !=
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    std::
                                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                  }
                                  if (iVar2 != (internal)0x0) {
                                    local_108._M_head_impl._0_4_ = 2;
                                    local_110.data_._0_4_ =
                                         *(float *)((long)&message->field_0 + 0x148);
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)local_f8,"2",
                                               "message.repeated_foreign_message_size()",
                                               (int *)&local_108,(int *)&local_110);
                                    iVar2 = local_f8[0];
                                    if (local_f8[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)&local_108);
                                      if (local_f0 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar19 = "";
                                      }
                                      else {
                                        pcVar19 = (local_f0->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_110,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                 ,0x102,pcVar19);
                                      testing::internal::AssertHelper::operator=
                                                (&local_110,(Message *)&local_108);
                                      testing::internal::AssertHelper::~AssertHelper(&local_110);
                                      if (local_108._M_head_impl !=
                                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        (**(code **)(*(long *)local_108._M_head_impl + 8))();
                                      }
                                    }
                                    if (local_f0 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                    }
                                    if (iVar2 != (internal)0x0) {
                                      local_108._M_head_impl._0_4_ = 2;
                                      local_110.data_._0_4_ =
                                           *(float *)((long)&message->field_0 + 0x160);
                                      testing::internal::CmpHelperEQ<int,int>
                                                ((internal *)local_f8,"2",
                                                 "message.repeated_import_message_size()",
                                                 (int *)&local_108,(int *)&local_110);
                                      iVar2 = local_f8[0];
                                      if (local_f8[0] == (internal)0x0) {
                                        testing::Message::Message((Message *)&local_108);
                                        if (local_f0 ==
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)0x0) {
                                          pcVar19 = "";
                                        }
                                        else {
                                          pcVar19 = (local_f0->_M_dataplus)._M_p;
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  (&local_110,kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x103,pcVar19);
                                        testing::internal::AssertHelper::operator=
                                                  (&local_110,(Message *)&local_108);
                                        testing::internal::AssertHelper::~AssertHelper(&local_110);
                                        if (local_108._M_head_impl !=
                                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)0x0) {
                                          (**(code **)(*(long *)local_108._M_head_impl + 8))();
                                        }
                                      }
                                      if (local_f0 !=
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        std::
                                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                      }
                                      if (iVar2 != (internal)0x0) {
                                        local_108._M_head_impl._0_4_ = 2;
                                        local_110.data_._0_4_ =
                                             *(float *)((long)&message->field_0 + 0x1d8);
                                        testing::internal::CmpHelperEQ<int,int>
                                                  ((internal *)local_f8,"2",
                                                   "message.repeated_lazy_message_size()",
                                                   (int *)&local_108,(int *)&local_110);
                                        iVar2 = local_f8[0];
                                        if (local_f8[0] == (internal)0x0) {
                                          testing::Message::Message((Message *)&local_108);
                                          if (local_f0 ==
                                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)0x0) {
                                            pcVar19 = "";
                                          }
                                          else {
                                            pcVar19 = (local_f0->_M_dataplus)._M_p;
                                          }
                                          testing::internal::AssertHelper::AssertHelper
                                                    (&local_110,kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x104,pcVar19);
                                          testing::internal::AssertHelper::operator=
                                                    (&local_110,(Message *)&local_108);
                                          testing::internal::AssertHelper::~AssertHelper(&local_110)
                                          ;
                                          if (local_108._M_head_impl !=
                                              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)0x0) {
                                            (**(code **)(*(long *)local_108._M_head_impl + 8))();
                                          }
                                        }
                                        if (local_f0 !=
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)0x0) {
                                          std::
                                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                        }
                                        if (iVar2 != (internal)0x0) {
                                          local_108._M_head_impl._0_4_ = 2;
                                          local_c0 = &(message->field_0)._impl_.
                                                      repeated_nested_enum_;
                                          local_110.data_._0_4_ =
                                               (float)internal::SooRep::size
                                                                (&local_c0->soo_rep_,
                                                                 (*(byte *)((long)&message->field_0
                                                                           + 0x170) & 4) == 0);
                                          testing::internal::CmpHelperEQ<int,int>
                                                    ((internal *)local_f8,"2",
                                                     "message.repeated_nested_enum_size()",
                                                     (int *)&local_108,(int *)&local_110);
                                          iVar2 = local_f8[0];
                                          if (local_f8[0] == (internal)0x0) {
                                            testing::Message::Message((Message *)&local_108);
                                            if (local_f0 ==
                                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)0x0) {
                                              pcVar19 = "";
                                            }
                                            else {
                                              pcVar19 = (local_f0->_M_dataplus)._M_p;
                                            }
                                            testing::internal::AssertHelper::AssertHelper
                                                      (&local_110,kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x105,pcVar19);
                                            testing::internal::AssertHelper::operator=
                                                      (&local_110,(Message *)&local_108);
                                            testing::internal::AssertHelper::~AssertHelper
                                                      (&local_110);
                                            if (local_108._M_head_impl !=
                                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)0x0) {
                                              (**(code **)(*(long *)local_108._M_head_impl + 8))();
                                            }
                                          }
                                          if (local_f0 !=
                                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)0x0) {
                                            std::
                                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                          }
                                          if (iVar2 != (internal)0x0) {
                                            local_108._M_head_impl._0_4_ = 2;
                                            local_c8 = &(message->field_0)._impl_.
                                                        repeated_foreign_enum_;
                                            local_110.data_._0_4_ =
                                                 (float)internal::SooRep::size
                                                                  (&local_c8->soo_rep_,
                                                                   (*(byte *)((long)&message->
                                                  field_0 + 0x180) & 4) == 0);
                                            testing::internal::CmpHelperEQ<int,int>
                                                      ((internal *)local_f8,"2",
                                                       "message.repeated_foreign_enum_size()",
                                                       (int *)&local_108,(int *)&local_110);
                                            iVar2 = local_f8[0];
                                            if (local_f8[0] == (internal)0x0) {
                                              testing::Message::Message((Message *)&local_108);
                                              if (local_f0 ==
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                pcVar19 = "";
                                              }
                                              else {
                                                pcVar19 = (local_f0->_M_dataplus)._M_p;
                                              }
                                              testing::internal::AssertHelper::AssertHelper
                                                        (&local_110,kFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x106,pcVar19);
                                              testing::internal::AssertHelper::operator=
                                                        (&local_110,(Message *)&local_108);
                                              testing::internal::AssertHelper::~AssertHelper
                                                        (&local_110);
                                              if (local_108._M_head_impl !=
                                                  (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                (**(code **)(*(long *)local_108._M_head_impl + 8))()
                                                ;
                                              }
                                            }
                                            if (local_f0 !=
                                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)0x0) {
                                              std::
                                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                            }
                                            if (iVar2 != (internal)0x0) {
                                              local_108._M_head_impl._0_4_ = 2;
                                              local_d0 = &(message->field_0)._impl_.
                                                          repeated_import_enum_;
                                              local_110.data_._0_4_ =
                                                   (float)internal::SooRep::size
                                                                    (&local_d0->soo_rep_,
                                                                     (*(byte *)((long)&message->
                                                  field_0 + 400) & 4) == 0);
                                              testing::internal::CmpHelperEQ<int,int>
                                                        ((internal *)local_f8,"2",
                                                         "message.repeated_import_enum_size()",
                                                         (int *)&local_108,(int *)&local_110);
                                              iVar2 = local_f8[0];
                                              if (local_f8[0] == (internal)0x0) {
                                                testing::Message::Message((Message *)&local_108);
                                                if (local_f0 ==
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  pcVar19 = "";
                                                }
                                                else {
                                                  pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                }
                                                testing::internal::AssertHelper::AssertHelper
                                                          (&local_110,kFatalFailure,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x107,pcVar19);
                                                testing::internal::AssertHelper::operator=
                                                          (&local_110,(Message *)&local_108);
                                                testing::internal::AssertHelper::~AssertHelper
                                                          (&local_110);
                                                if (local_108._M_head_impl !=
                                                    (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  (**(code **)(*(long *)local_108._M_head_impl + 8))
                                                            ();
                                                }
                                              }
                                              if (local_f0 !=
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                std::
                                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                              }
                                              if (iVar2 != (internal)0x0) {
                                                local_108._M_head_impl._0_4_ = 0xc9;
                                                piVar6 = RepeatedField<int>::Get(this,0);
                                                local_110.data_._0_4_ = (float)*piVar6;
                                                testing::internal::CmpHelperEQ<int,int>
                                                          ((internal *)local_f8,"201",
                                                           "message.repeated_int32(0)",
                                                           (int *)&local_108,(int *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x10a,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_110.data_._0_4_ = 2.83062e-43;
                                                plVar7 = RepeatedField<long>::Get(this_00,0);
                                                local_108._M_head_impl =
                                                     (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)*plVar7;
                                                testing::internal::CmpHelperEQ<int,long>
                                                          ((internal *)local_f8,"202",
                                                           "message.repeated_int64(0)",
                                                           (int *)&local_110,(long *)&local_108);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x10b,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ = 0xcb;
                                                puVar8 = RepeatedField<unsigned_int>::Get(this_01,0)
                                                ;
                                                local_110.data_._0_4_ = (float)*puVar8;
                                                testing::internal::CmpHelperEQ<int,unsigned_int>
                                                          ((internal *)local_f8,"203",
                                                           "message.repeated_uint32(0)",
                                                           (int *)&local_108,(uint *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x10c,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_110.data_._0_4_ = 2.85865e-43;
                                                puVar9 = RepeatedField<unsigned_long>::Get
                                                                   (local_70,0);
                                                local_108._M_head_impl =
                                                     (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)*puVar9;
                                                testing::internal::CmpHelperEQ<int,unsigned_long>
                                                          ((internal *)local_f8,"204",
                                                           "message.repeated_uint64(0)",
                                                           (int *)&local_110,
                                                           (unsigned_long *)&local_108);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x10d,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ = 0xcd;
                                                piVar6 = RepeatedField<int>::Get(local_78,0);
                                                local_110.data_._0_4_ = (float)*piVar6;
                                                testing::internal::CmpHelperEQ<int,int>
                                                          ((internal *)local_f8,"205",
                                                           "message.repeated_sint32(0)",
                                                           (int *)&local_108,(int *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x10e,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_110.data_._0_4_ = 2.88667e-43;
                                                plVar7 = RepeatedField<long>::Get(local_80,0);
                                                local_108._M_head_impl =
                                                     (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)*plVar7;
                                                testing::internal::CmpHelperEQ<int,long>
                                                          ((internal *)local_f8,"206",
                                                           "message.repeated_sint64(0)",
                                                           (int *)&local_110,(long *)&local_108);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x10f,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ = 0xcf;
                                                puVar8 = RepeatedField<unsigned_int>::Get
                                                                   (local_88,0);
                                                local_110.data_._0_4_ = (float)*puVar8;
                                                testing::internal::CmpHelperEQ<int,unsigned_int>
                                                          ((internal *)local_f8,"207",
                                                           "message.repeated_fixed32(0)",
                                                           (int *)&local_108,(uint *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x110,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_110.data_._0_4_ = 2.9147e-43;
                                                puVar9 = RepeatedField<unsigned_long>::Get
                                                                   (local_90,0);
                                                local_108._M_head_impl =
                                                     (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)*puVar9;
                                                testing::internal::CmpHelperEQ<int,unsigned_long>
                                                          ((internal *)local_f8,"208",
                                                           "message.repeated_fixed64(0)",
                                                           (int *)&local_110,
                                                           (unsigned_long *)&local_108);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x111,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ = 0xd1;
                                                piVar6 = RepeatedField<int>::Get(local_98,0);
                                                local_110.data_._0_4_ = (float)*piVar6;
                                                testing::internal::CmpHelperEQ<int,int>
                                                          ((internal *)local_f8,"209",
                                                           "message.repeated_sfixed32(0)",
                                                           (int *)&local_108,(int *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x112,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_110.data_._0_4_ = 2.94273e-43;
                                                plVar7 = RepeatedField<long>::Get(local_a0,0);
                                                local_108._M_head_impl =
                                                     (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)*plVar7;
                                                testing::internal::CmpHelperEQ<int,long>
                                                          ((internal *)local_f8,"210",
                                                           "message.repeated_sfixed64(0)",
                                                           (int *)&local_110,(long *)&local_108);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x113,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ = 0xd3;
                                                pfVar10 = RepeatedField<float>::Get(local_a8,0);
                                                local_110.data_._0_4_ = *pfVar10;
                                                testing::internal::CmpHelperEQ<int,float>
                                                          ((internal *)local_f8,"211",
                                                           "message.repeated_float(0)",
                                                           (int *)&local_108,(float *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x114,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_110.data_._0_4_ = 2.97075e-43;
                                                pdVar11 = RepeatedField<double>::Get(local_b0,0);
                                                local_108._M_head_impl =
                                                     (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)*pdVar11;
                                                testing::internal::CmpHelperEQ<int,double>
                                                          ((internal *)local_f8,"212",
                                                           "message.repeated_double(0)",
                                                           (int *)&local_110,(double *)&local_108);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x115,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_1_ = 1;
                                                pbVar12 = RepeatedField<bool>::Get(local_b8,0);
                                                local_110.data_._0_4_ =
                                                     (float)CONCAT31(local_110.data_._1_3_,*pbVar12)
                                                ;
                                                testing::internal::CmpHelperEQ<bool,bool>
                                                          ((internal *)local_f8,"true",
                                                           "message.repeated_bool(0)",
                                                           (bool *)&local_108,(bool *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x116,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_38 = &(message->field_0)._impl_.
                                                            repeated_string_.
                                                            super_RepeatedPtrFieldBase;
                                                pVVar13 = internal::RepeatedPtrFieldBase::
                                                                                                                    
                                                  Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                                            (local_38,0);
                                                testing::internal::
                                                CmpHelperEQ<char[4],std::__cxx11::string>
                                                          ((internal *)local_f8,"\"215\"",
                                                           "message.repeated_string(0)",
                                                           (char (*) [4])"215",pVVar13);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x117,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_40 = &(message->field_0)._impl_.
                                                            repeated_bytes_.
                                                            super_RepeatedPtrFieldBase;
                                                pVVar13 = internal::RepeatedPtrFieldBase::
                                                                                                                    
                                                  Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                                            (local_40,0);
                                                testing::internal::
                                                CmpHelperEQ<char[4],std::__cxx11::string>
                                                          ((internal *)local_f8,"\"216\"",
                                                           "message.repeated_bytes(0)",
                                                           (char (*) [4])"216",pVVar13);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x118,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ = 0xd9;
                                                local_48 = &(message->field_0)._impl_.repeatedgroup_
                                                            .super_RepeatedPtrFieldBase;
                                                pVVar14 = internal::RepeatedPtrFieldBase::
                                                                                                                    
                                                  Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite_RepeatedGroup>>
                                                            (local_48,0);
                                                local_110.data_._0_4_ =
                                                     (float)(pVVar14->field_0)._impl_.a_;
                                                testing::internal::CmpHelperEQ<int,int>
                                                          ((internal *)local_f8,"217",
                                                           "message.repeatedgroup(0).a()",
                                                           (int *)&local_108,(int *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x11a,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ = 0xda;
                                                local_50 = &(message->field_0)._impl_.
                                                            repeated_nested_message_.
                                                            super_RepeatedPtrFieldBase;
                                                pVVar15 = internal::RepeatedPtrFieldBase::
                                                                                                                    
                                                  Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite_NestedMessage>>
                                                            (local_50,0);
                                                local_110.data_._0_4_ =
                                                     (float)(pVVar15->field_0)._impl_.bb_;
                                                testing::internal::CmpHelperEQ<int,int>
                                                          ((internal *)local_f8,"218",
                                                           "message.repeated_nested_message(0).bb()"
                                                           ,(int *)&local_108,(int *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x11b,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ = 0xdb;
                                                local_58 = &(message->field_0)._impl_.
                                                            repeated_foreign_message_.
                                                            super_RepeatedPtrFieldBase;
                                                pVVar16 = internal::RepeatedPtrFieldBase::
                                                                                                                    
                                                  Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::ForeignMessageLite>>
                                                            (local_58,0);
                                                local_110.data_._0_4_ =
                                                     (float)(pVVar16->field_0)._impl_.c_;
                                                testing::internal::CmpHelperEQ<int,int>
                                                          ((internal *)local_f8,"219",
                                                           "message.repeated_foreign_message(0).c()"
                                                           ,(int *)&local_108,(int *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x11c,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ = 0xdc;
                                                local_60 = &(message->field_0)._impl_.
                                                            repeated_import_message_.
                                                            super_RepeatedPtrFieldBase;
                                                pVVar17 = internal::RepeatedPtrFieldBase::
                                                                                                                    
                                                  Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessageLite>>
                                                            (local_60,0);
                                                local_110.data_._0_4_ =
                                                     (float)(pVVar17->field_0)._impl_.d_;
                                                testing::internal::CmpHelperEQ<int,int>
                                                          ((internal *)local_f8,"220",
                                                           "message.repeated_import_message(0).d()",
                                                           (int *)&local_108,(int *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x11d,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ = 0xe3;
                                                local_68 = &(message->field_0)._impl_.
                                                            repeated_lazy_message_.
                                                            super_RepeatedPtrFieldBase;
                                                pVVar15 = internal::RepeatedPtrFieldBase::
                                                                                                                    
                                                  Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite_NestedMessage>>
                                                            (local_68,0);
                                                local_110.data_._0_4_ =
                                                     (float)(pVVar15->field_0)._impl_.bb_;
                                                testing::internal::CmpHelperEQ<int,int>
                                                          ((internal *)local_f8,"227",
                                                           "message.repeated_lazy_message(0).bb()",
                                                           (int *)&local_108,(int *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x11e,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                piVar6 = RepeatedField<int>::Get(local_c0,0);
                                                local_108._M_head_impl._0_4_ = *piVar6;
                                                testing::internal::
                                                CmpHelperEQ<proto2_unittest::TestAllTypesLite_NestedEnum,proto2_unittest::TestAllTypesLite_NestedEnum>
                                                          ((internal *)local_f8,
                                                           "unittest::TestAllTypesLite::BAR",
                                                           "message.repeated_nested_enum(0)",
                                                           &proto2_unittest::TestAllTypesLite::BAR,
                                                           (TestAllTypesLite_NestedEnum *)&local_108
                                                          );
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x121,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ = 5;
                                                piVar6 = RepeatedField<int>::Get(local_c8,0);
                                                local_110.data_._0_4_ = (float)*piVar6;
                                                testing::internal::
                                                CmpHelperEQ<proto2_unittest::ForeignEnumLite,proto2_unittest::ForeignEnumLite>
                                                          ((internal *)local_f8,
                                                           "unittest::FOREIGN_LITE_BAR",
                                                           "message.repeated_foreign_enum(0)",
                                                           (ForeignEnumLite *)&local_108,
                                                           (ForeignEnumLite *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x122,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ = 8;
                                                piVar6 = RepeatedField<int>::Get(local_d0,0);
                                                local_110.data_._0_4_ = (float)*piVar6;
                                                testing::internal::
                                                CmpHelperEQ<proto2_unittest_import::ImportEnumLite,proto2_unittest_import::ImportEnumLite>
                                                          ((internal *)local_f8,
                                                           "unittest_import::IMPORT_LITE_BAR",
                                                           "message.repeated_import_enum(0)",
                                                           (ImportEnumLite *)&local_108,
                                                           (ImportEnumLite *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x123,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ = 0x12d;
                                                piVar6 = RepeatedField<int>::Get(this,1);
                                                local_110.data_._0_4_ = (float)*piVar6;
                                                testing::internal::CmpHelperEQ<int,int>
                                                          ((internal *)local_f8,"301",
                                                           "message.repeated_int32(1)",
                                                           (int *)&local_108,(int *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x125,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_110.data_._0_4_ = 4.23192e-43;
                                                plVar7 = RepeatedField<long>::Get(this_00,1);
                                                local_108._M_head_impl =
                                                     (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)*plVar7;
                                                testing::internal::CmpHelperEQ<int,long>
                                                          ((internal *)local_f8,"302",
                                                           "message.repeated_int64(1)",
                                                           (int *)&local_110,(long *)&local_108);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x126,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ = 0x12f;
                                                puVar8 = RepeatedField<unsigned_int>::Get(this_01,1)
                                                ;
                                                local_110.data_._0_4_ = (float)*puVar8;
                                                testing::internal::CmpHelperEQ<int,unsigned_int>
                                                          ((internal *)local_f8,"303",
                                                           "message.repeated_uint32(1)",
                                                           (int *)&local_108,(uint *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x127,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_110.data_._0_4_ = 4.25995e-43;
                                                puVar9 = RepeatedField<unsigned_long>::Get
                                                                   (local_70,1);
                                                local_108._M_head_impl =
                                                     (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)*puVar9;
                                                testing::internal::CmpHelperEQ<int,unsigned_long>
                                                          ((internal *)local_f8,"304",
                                                           "message.repeated_uint64(1)",
                                                           (int *)&local_110,
                                                           (unsigned_long *)&local_108);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x128,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ = 0x131;
                                                piVar6 = RepeatedField<int>::Get(local_78,1);
                                                local_110.data_._0_4_ = (float)*piVar6;
                                                testing::internal::CmpHelperEQ<int,int>
                                                          ((internal *)local_f8,"305",
                                                           "message.repeated_sint32(1)",
                                                           (int *)&local_108,(int *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x129,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_110.data_._0_4_ = 4.28797e-43;
                                                plVar7 = RepeatedField<long>::Get(local_80,1);
                                                local_108._M_head_impl =
                                                     (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)*plVar7;
                                                testing::internal::CmpHelperEQ<int,long>
                                                          ((internal *)local_f8,"306",
                                                           "message.repeated_sint64(1)",
                                                           (int *)&local_110,(long *)&local_108);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x12a,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ = 0x133;
                                                puVar8 = RepeatedField<unsigned_int>::Get
                                                                   (local_88,1);
                                                local_110.data_._0_4_ = (float)*puVar8;
                                                testing::internal::CmpHelperEQ<int,unsigned_int>
                                                          ((internal *)local_f8,"307",
                                                           "message.repeated_fixed32(1)",
                                                           (int *)&local_108,(uint *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,299,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_110.data_._0_4_ = 4.316e-43;
                                                puVar9 = RepeatedField<unsigned_long>::Get
                                                                   (local_90,1);
                                                local_108._M_head_impl =
                                                     (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)*puVar9;
                                                testing::internal::CmpHelperEQ<int,unsigned_long>
                                                          ((internal *)local_f8,"308",
                                                           "message.repeated_fixed64(1)",
                                                           (int *)&local_110,
                                                           (unsigned_long *)&local_108);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,300,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ = 0x135;
                                                piVar6 = RepeatedField<int>::Get(local_98,1);
                                                local_110.data_._0_4_ = (float)*piVar6;
                                                testing::internal::CmpHelperEQ<int,int>
                                                          ((internal *)local_f8,"309",
                                                           "message.repeated_sfixed32(1)",
                                                           (int *)&local_108,(int *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x12d,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_110.data_._0_4_ = 4.34403e-43;
                                                plVar7 = RepeatedField<long>::Get(local_a0,1);
                                                local_108._M_head_impl =
                                                     (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)*plVar7;
                                                testing::internal::CmpHelperEQ<int,long>
                                                          ((internal *)local_f8,"310",
                                                           "message.repeated_sfixed64(1)",
                                                           (int *)&local_110,(long *)&local_108);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x12e,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ = 0x137;
                                                pfVar10 = RepeatedField<float>::Get(local_a8,1);
                                                local_110.data_._0_4_ = *pfVar10;
                                                testing::internal::CmpHelperEQ<int,float>
                                                          ((internal *)local_f8,"311",
                                                           "message.repeated_float(1)",
                                                           (int *)&local_108,(float *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x12f,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_110.data_._0_4_ = 4.37205e-43;
                                                pdVar11 = RepeatedField<double>::Get(local_b0,1);
                                                local_108._M_head_impl =
                                                     (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)*pdVar11;
                                                testing::internal::CmpHelperEQ<int,double>
                                                          ((internal *)local_f8,"312",
                                                           "message.repeated_double(1)",
                                                           (int *)&local_110,(double *)&local_108);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x130,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                pbVar12 = RepeatedField<bool>::Get(local_b8,1);
                                                local_108._M_head_impl =
                                                     (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(CONCAT71(local_108._M_head_impl._1_7_,*pbVar12)
                                                    ^ 1);
                                                local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                if (*pbVar12 == true) {
                                                  testing::Message::Message((Message *)&local_110);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)local_f8,
                                                             (internal *)&local_108,
                                                             (AssertionResult *)
                                                             "message.repeated_bool(1)","true",
                                                             "false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_d8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x133,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                }
                                                if (local_100 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_100,local_100);
                                                }
                                                pVVar13 = internal::RepeatedPtrFieldBase::
                                                                                                                    
                                                  Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                                            (local_38,1);
                                                testing::internal::
                                                CmpHelperEQ<char[4],std::__cxx11::string>
                                                          ((internal *)local_f8,"\"315\"",
                                                           "message.repeated_string(1)",
                                                           (char (*) [4])"315",pVVar13);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x134,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                pVVar13 = internal::RepeatedPtrFieldBase::
                                                                                                                    
                                                  Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                                            (local_40,1);
                                                testing::internal::
                                                CmpHelperEQ<char[4],std::__cxx11::string>
                                                          ((internal *)local_f8,"\"316\"",
                                                           "message.repeated_bytes(1)",
                                                           (char (*) [4])"316",pVVar13);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x135,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ = 0x13d;
                                                pVVar14 = internal::RepeatedPtrFieldBase::
                                                                                                                    
                                                  Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite_RepeatedGroup>>
                                                            (local_48,1);
                                                local_110.data_._0_4_ =
                                                     (float)(pVVar14->field_0)._impl_.a_;
                                                testing::internal::CmpHelperEQ<int,int>
                                                          ((internal *)local_f8,"317",
                                                           "message.repeatedgroup(1).a()",
                                                           (int *)&local_108,(int *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x137,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ = 0x13e;
                                                pVVar15 = internal::RepeatedPtrFieldBase::
                                                                                                                    
                                                  Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite_NestedMessage>>
                                                            (local_50,1);
                                                local_110.data_._0_4_ =
                                                     (float)(pVVar15->field_0)._impl_.bb_;
                                                testing::internal::CmpHelperEQ<int,int>
                                                          ((internal *)local_f8,"318",
                                                           "message.repeated_nested_message(1).bb()"
                                                           ,(int *)&local_108,(int *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x138,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ = 0x13f;
                                                pVVar16 = internal::RepeatedPtrFieldBase::
                                                                                                                    
                                                  Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::ForeignMessageLite>>
                                                            (local_58,1);
                                                local_110.data_._0_4_ =
                                                     (float)(pVVar16->field_0)._impl_.c_;
                                                testing::internal::CmpHelperEQ<int,int>
                                                          ((internal *)local_f8,"319",
                                                           "message.repeated_foreign_message(1).c()"
                                                           ,(int *)&local_108,(int *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x139,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ = 0x140;
                                                pVVar17 = internal::RepeatedPtrFieldBase::
                                                                                                                    
                                                  Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessageLite>>
                                                            (local_60,1);
                                                local_110.data_._0_4_ =
                                                     (float)(pVVar17->field_0)._impl_.d_;
                                                testing::internal::CmpHelperEQ<int,int>
                                                          ((internal *)local_f8,"320",
                                                           "message.repeated_import_message(1).d()",
                                                           (int *)&local_108,(int *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x13a,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ = 0x147;
                                                pVVar15 = internal::RepeatedPtrFieldBase::
                                                                                                                    
                                                  Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite_NestedMessage>>
                                                            (local_68,1);
                                                local_110.data_._0_4_ =
                                                     (float)(pVVar15->field_0)._impl_.bb_;
                                                testing::internal::CmpHelperEQ<int,int>
                                                          ((internal *)local_f8,"327",
                                                           "message.repeated_lazy_message(1).bb()",
                                                           (int *)&local_108,(int *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x13b,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                piVar6 = RepeatedField<int>::Get(local_c0,1);
                                                local_108._M_head_impl._0_4_ = *piVar6;
                                                testing::internal::
                                                CmpHelperEQ<proto2_unittest::TestAllTypesLite_NestedEnum,proto2_unittest::TestAllTypesLite_NestedEnum>
                                                          ((internal *)local_f8,
                                                           "unittest::TestAllTypesLite::BAZ",
                                                           "message.repeated_nested_enum(1)",
                                                           &proto2_unittest::TestAllTypesLite::BAZ,
                                                           (TestAllTypesLite_NestedEnum *)&local_108
                                                          );
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x13d,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ = 6;
                                                piVar6 = RepeatedField<int>::Get(local_c8,1);
                                                local_110.data_._0_4_ = (float)*piVar6;
                                                testing::internal::
                                                CmpHelperEQ<proto2_unittest::ForeignEnumLite,proto2_unittest::ForeignEnumLite>
                                                          ((internal *)local_f8,
                                                           "unittest::FOREIGN_LITE_BAZ",
                                                           "message.repeated_foreign_enum(1)",
                                                           (ForeignEnumLite *)&local_108,
                                                           (ForeignEnumLite *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x13e,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ = 9;
                                                piVar6 = RepeatedField<int>::Get(local_d0,1);
                                                local_110.data_._0_4_ = (float)*piVar6;
                                                testing::internal::
                                                CmpHelperEQ<proto2_unittest_import::ImportEnumLite,proto2_unittest_import::ImportEnumLite>
                                                          ((internal *)local_f8,
                                                           "unittest_import::IMPORT_LITE_BAZ",
                                                           "message.repeated_import_enum(1)",
                                                           (ImportEnumLite *)&local_108,
                                                           (ImportEnumLite *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x13f,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                uVar4 = (message->field_0)._impl_._has_bits_.
                                                        has_bits_[1] & 4;
                                                local_108._M_head_impl._0_1_ = (char)(uVar4 >> 2);
                                                local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                if (uVar4 == 0) {
                                                  testing::Message::Message((Message *)&local_110);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)local_f8,
                                                             (internal *)&local_108,
                                                             (AssertionResult *)
                                                             "message.has_default_int32()","false",
                                                             "true",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_d8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x144,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                }
                                                if (local_100 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_100,local_100);
                                                }
                                                uVar4 = (message->field_0)._impl_._has_bits_.
                                                        has_bits_[1] & 2;
                                                local_108._M_head_impl._0_1_ = (char)(uVar4 >> 1);
                                                local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                if (uVar4 == 0) {
                                                  testing::Message::Message((Message *)&local_110);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)local_f8,
                                                             (internal *)&local_108,
                                                             (AssertionResult *)
                                                             "message.has_default_int64()","false",
                                                             "true",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_d8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x145,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                }
                                                if (local_100 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_100,local_100);
                                                }
                                                uVar4 = (message->field_0)._impl_._has_bits_.
                                                        has_bits_[1] & 8;
                                                local_108._M_head_impl._0_1_ = (char)(uVar4 >> 3);
                                                local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                if (uVar4 == 0) {
                                                  testing::Message::Message((Message *)&local_110);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)local_f8,
                                                             (internal *)&local_108,
                                                             (AssertionResult *)
                                                             "message.has_default_uint32()","false",
                                                             "true",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_d8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x146,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                }
                                                if (local_100 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_100,local_100);
                                                }
                                                uVar4 = (message->field_0)._impl_._has_bits_.
                                                        has_bits_[1] & 0x10;
                                                local_108._M_head_impl._0_1_ = (char)(uVar4 >> 4);
                                                local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                if (uVar4 == 0) {
                                                  testing::Message::Message((Message *)&local_110);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)local_f8,
                                                             (internal *)&local_108,
                                                             (AssertionResult *)
                                                             "message.has_default_uint64()","false",
                                                             "true",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_d8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x147,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                }
                                                if (local_100 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_100,local_100);
                                                }
                                                uVar4 = (message->field_0)._impl_._has_bits_.
                                                        has_bits_[1] & 0x40;
                                                local_108._M_head_impl._0_1_ = (char)(uVar4 >> 6);
                                                local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                if (uVar4 == 0) {
                                                  testing::Message::Message((Message *)&local_110);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)local_f8,
                                                             (internal *)&local_108,
                                                             (AssertionResult *)
                                                             "message.has_default_sint32()","false",
                                                             "true",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_d8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x148,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                }
                                                if (local_100 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_100,local_100);
                                                }
                                                uVar4 = (message->field_0)._impl_._has_bits_.
                                                        has_bits_[1] & 0x20;
                                                local_108._M_head_impl._0_1_ = (char)(uVar4 >> 5);
                                                local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                if (uVar4 == 0) {
                                                  testing::Message::Message((Message *)&local_110);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)local_f8,
                                                             (internal *)&local_108,
                                                             (AssertionResult *)
                                                             "message.has_default_sint64()","false",
                                                             "true",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_d8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x149,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                }
                                                if (local_100 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_100,local_100);
                                                }
                                                bVar3 = *(byte *)((long)&message->field_0 + 4);
                                                local_108._M_head_impl._0_1_ = bVar3 >> 7;
                                                local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                if (-1 < (char)bVar3) {
                                                  testing::Message::Message((Message *)&local_110);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)local_f8,
                                                             (internal *)&local_108,
                                                             (AssertionResult *)
                                                             "message.has_default_fixed32()","false"
                                                             ,"true",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_d8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x14a,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                }
                                                if (local_100 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_100,local_100);
                                                }
                                                uVar4 = (message->field_0)._impl_._has_bits_.
                                                        has_bits_[1] & 0x100;
                                                local_108._M_head_impl._0_1_ = (char)(uVar4 >> 8);
                                                local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                if (uVar4 == 0) {
                                                  testing::Message::Message((Message *)&local_110);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)local_f8,
                                                             (internal *)&local_108,
                                                             (AssertionResult *)
                                                             "message.has_default_fixed64()","false"
                                                             ,"true",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_d8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x14b,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                }
                                                if (local_100 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_100,local_100);
                                                }
                                                uVar4 = (message->field_0)._impl_._has_bits_.
                                                        has_bits_[1] & 0x400;
                                                local_108._M_head_impl._0_1_ = (char)(uVar4 >> 10);
                                                local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                if (uVar4 == 0) {
                                                  testing::Message::Message((Message *)&local_110);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)local_f8,
                                                             (internal *)&local_108,
                                                             (AssertionResult *)
                                                             "message.has_default_sfixed32()",
                                                             "false","true",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_d8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x14c,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                }
                                                if (local_100 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_100,local_100);
                                                }
                                                uVar4 = (message->field_0)._impl_._has_bits_.
                                                        has_bits_[1] & 0x200;
                                                local_108._M_head_impl._0_1_ = (char)(uVar4 >> 9);
                                                local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                if (uVar4 == 0) {
                                                  testing::Message::Message((Message *)&local_110);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)local_f8,
                                                             (internal *)&local_108,
                                                             (AssertionResult *)
                                                             "message.has_default_sfixed64()",
                                                             "false","true",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_d8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x14d,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                }
                                                if (local_100 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_100,local_100);
                                                }
                                                uVar4 = (message->field_0)._impl_._has_bits_.
                                                        has_bits_[1] & 0x800;
                                                local_108._M_head_impl._0_1_ = (char)(uVar4 >> 0xb);
                                                local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                if (uVar4 == 0) {
                                                  testing::Message::Message((Message *)&local_110);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)local_f8,
                                                             (internal *)&local_108,
                                                             (AssertionResult *)
                                                             "message.has_default_float()","false",
                                                             "true",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_d8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x14e,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                }
                                                if (local_100 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_100,local_100);
                                                }
                                                uVar4 = (message->field_0)._impl_._has_bits_.
                                                        has_bits_[1] & 0x1000;
                                                local_108._M_head_impl._0_1_ = (char)(uVar4 >> 0xc);
                                                local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                if (uVar4 == 0) {
                                                  testing::Message::Message((Message *)&local_110);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)local_f8,
                                                             (internal *)&local_108,
                                                             (AssertionResult *)
                                                             "message.has_default_double()","false",
                                                             "true",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_d8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x14f,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                }
                                                if (local_100 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_100,local_100);
                                                }
                                                uVar4 = (message->field_0)._impl_._has_bits_.
                                                        has_bits_[1] & 0x2000;
                                                local_108._M_head_impl._0_1_ = (char)(uVar4 >> 0xd);
                                                local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                if (uVar4 == 0) {
                                                  testing::Message::Message((Message *)&local_110);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)local_f8,
                                                             (internal *)&local_108,
                                                             (AssertionResult *)
                                                             "message.has_default_bool()","false",
                                                             "true",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_d8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x150,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                }
                                                if (local_100 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_100,local_100);
                                                }
                                                uVar4 = (message->field_0)._impl_._has_bits_.
                                                        has_bits_[0] & 0x8000000;
                                                local_108._M_head_impl._0_1_ = (byte)(uVar4 >> 0x1b)
                                                ;
                                                local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                if (uVar4 == 0) {
                                                  testing::Message::Message((Message *)&local_110);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)local_f8,
                                                             (internal *)&local_108,
                                                             (AssertionResult *)
                                                             "message.has_default_string()","false",
                                                             "true",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_d8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x151,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                }
                                                if (local_100 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_100,local_100);
                                                }
                                                uVar4 = (message->field_0)._impl_._has_bits_.
                                                        has_bits_[0] & 0x10000000;
                                                local_108._M_head_impl._0_1_ = (byte)(uVar4 >> 0x1c)
                                                ;
                                                local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                if (uVar4 == 0) {
                                                  testing::Message::Message((Message *)&local_110);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)local_f8,
                                                             (internal *)&local_108,
                                                             (AssertionResult *)
                                                             "message.has_default_bytes()","false",
                                                             "true",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_d8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x152,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                }
                                                if (local_100 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_100,local_100);
                                                }
                                                uVar4 = (message->field_0)._impl_._has_bits_.
                                                        has_bits_[1] & 0x4000;
                                                local_108._M_head_impl._0_1_ = (char)(uVar4 >> 0xe);
                                                local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                if (uVar4 == 0) {
                                                  testing::Message::Message((Message *)&local_110);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)local_f8,
                                                             (internal *)&local_108,
                                                             (AssertionResult *)
                                                             "message.has_default_nested_enum()",
                                                             "false","true",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_d8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x154,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                }
                                                if (local_100 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_100,local_100);
                                                }
                                                uVar4 = (message->field_0)._impl_._has_bits_.
                                                        has_bits_[1] & 0x8000;
                                                local_108._M_head_impl._0_1_ = (char)(uVar4 >> 0xf);
                                                local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                if (uVar4 == 0) {
                                                  testing::Message::Message((Message *)&local_110);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)local_f8,
                                                             (internal *)&local_108,
                                                             (AssertionResult *)
                                                             "message.has_default_foreign_enum()",
                                                             "false","true",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_d8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x155,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                }
                                                if (local_100 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_100,local_100);
                                                }
                                                uVar4 = (message->field_0)._impl_._has_bits_.
                                                        has_bits_[1] & 0x10000;
                                                local_108._M_head_impl._0_1_ = (char)(uVar4 >> 0x10)
                                                ;
                                                local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                if (uVar4 == 0) {
                                                  testing::Message::Message((Message *)&local_110);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)local_f8,
                                                             (internal *)&local_108,
                                                             (AssertionResult *)
                                                             "message.has_default_import_enum()",
                                                             "false","true",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_d8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x156,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                }
                                                if (local_100 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_100,local_100);
                                                }
                                                local_108._M_head_impl._0_4_ = 0x191;
                                                local_110.data_._0_4_ =
                                                     (float)(message->field_0)._impl_.default_int32_
                                                ;
                                                testing::internal::CmpHelperEQ<int,int>
                                                          ((internal *)local_f8,"401",
                                                           "message.default_int32()",
                                                           (int *)&local_108,(int *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x159,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_110.data_._0_4_ = 5.63322e-43;
                                                local_108._M_head_impl =
                                                     *(
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  **)((long)&message->field_0 + 0x2d0);
                                                testing::internal::CmpHelperEQ<int,long>
                                                          ((internal *)local_f8,"402",
                                                           "message.default_int64()",
                                                           (int *)&local_110,(long *)&local_108);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x15a,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ = 0x193;
                                                local_110.data_._0_4_ =
                                                     (float)(message->field_0)._impl_.
                                                            default_uint32_;
                                                testing::internal::CmpHelperEQ<int,unsigned_int>
                                                          ((internal *)local_f8,"403",
                                                           "message.default_uint32()",
                                                           (int *)&local_108,(uint *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x15b,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_110.data_._0_4_ = 5.66125e-43;
                                                local_108._M_head_impl =
                                                     *(
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  **)((long)&message->field_0 + 0x2e0);
                                                testing::internal::CmpHelperEQ<int,unsigned_long>
                                                          ((internal *)local_f8,"404",
                                                           "message.default_uint64()",
                                                           (int *)&local_110,
                                                           (unsigned_long *)&local_108);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x15c,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ = 0x195;
                                                local_110.data_._0_4_ =
                                                     (float)(message->field_0)._impl_.
                                                            default_sint32_;
                                                testing::internal::CmpHelperEQ<int,int>
                                                          ((internal *)local_f8,"405",
                                                           "message.default_sint32()",
                                                           (int *)&local_108,(int *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x15d,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_110.data_._0_4_ = 5.68927e-43;
                                                local_108._M_head_impl =
                                                     *(
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  **)((long)&message->field_0 + 0x2e8);
                                                testing::internal::CmpHelperEQ<int,long>
                                                          ((internal *)local_f8,"406",
                                                           "message.default_sint64()",
                                                           (int *)&local_110,(long *)&local_108);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x15e,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ = 0x197;
                                                local_110.data_._0_4_ =
                                                     (float)(message->field_0)._impl_.
                                                            default_fixed32_;
                                                testing::internal::CmpHelperEQ<int,unsigned_int>
                                                          ((internal *)local_f8,"407",
                                                           "message.default_fixed32()",
                                                           (int *)&local_108,(uint *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x15f,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_110.data_._0_4_ = 5.7173e-43;
                                                local_108._M_head_impl =
                                                     *(
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  **)((long)&message->field_0 + 0x2f8);
                                                testing::internal::CmpHelperEQ<int,unsigned_long>
                                                          ((internal *)local_f8,"408",
                                                           "message.default_fixed64()",
                                                           (int *)&local_110,
                                                           (unsigned_long *)&local_108);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x160,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ = 0x199;
                                                local_110.data_._0_4_ =
                                                     (float)(message->field_0)._impl_.
                                                            default_sfixed32_;
                                                testing::internal::CmpHelperEQ<int,int>
                                                          ((internal *)local_f8,"409",
                                                           "message.default_sfixed32()",
                                                           (int *)&local_108,(int *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x161,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_110.data_._0_4_ = 5.74532e-43;
                                                local_108._M_head_impl =
                                                     *(
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  **)((long)&message->field_0 + 0x300);
                                                testing::internal::CmpHelperEQ<int,long>
                                                          ((internal *)local_f8,"410",
                                                           "message.default_sfixed64()",
                                                           (int *)&local_110,(long *)&local_108);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x162,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ = 0x19b;
                                                local_110.data_._0_4_ =
                                                     (message->field_0)._impl_.default_float_;
                                                testing::internal::CmpHelperEQ<int,float>
                                                          ((internal *)local_f8,"411",
                                                           "message.default_float()",
                                                           (int *)&local_108,(float *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x163,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_110.data_._0_4_ = 5.77335e-43;
                                                local_108._M_head_impl =
                                                     *(
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  **)((long)&message->field_0 + 0x310);
                                                testing::internal::CmpHelperEQ<int,double>
                                                          ((internal *)local_f8,"412",
                                                           "message.default_double()",
                                                           (int *)&local_110,(double *)&local_108);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x164,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                bVar20 = (message->field_0)._impl_.default_bool_;
                                                local_108._M_head_impl =
                                                     (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(CONCAT71(local_108._M_head_impl._1_7_,bVar20) ^
                                                    1);
                                                local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                if (bVar20 == true) {
                                                  testing::Message::Message((Message *)&local_110);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)local_f8,
                                                             (internal *)&local_108,
                                                             (AssertionResult *)
                                                             "message.default_bool()","true","false"
                                                             ,in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_d8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x165,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                }
                                                if (local_100 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_100,local_100);
                                                }
                                                uVar1 = *(ulong *)((long)&message->field_0 + 0x298);
                                                if ((uVar1 & 3) == 0) {
                                                  pbVar18 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)proto2_unittest::TestAllTypesLite::Impl_::
                                                                                                        
                                                  _i_give_permission_to_break_this_code_default_default_string_
                                                  ._32_8_;
                                                  if (proto2_unittest::TestAllTypesLite::Impl_::
                                                                                                            
                                                  _i_give_permission_to_break_this_code_default_default_string_
                                                  ._32_8_ == 0) {
                                                    pbVar18 = internal::LazyString::Init_abi_cxx11_
                                                                        ((LazyString *)
                                                                         proto2_unittest::
                                                                         TestAllTypesLite::Impl_::
                                                                                                                                                  
                                                  _i_give_permission_to_break_this_code_default_default_string_
                                                  );
                                                  }
                                                }
                                                else {
                                                  pbVar18 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(uVar1 & 0xfffffffffffffffc);
                                                }
                                                testing::internal::
                                                CmpHelperEQ<char[4],std::__cxx11::string>
                                                          ((internal *)local_f8,"\"415\"",
                                                           "message.default_string()",
                                                           (char (*) [4])"415",pbVar18);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x166,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                uVar1 = *(ulong *)((long)&message->field_0 + 0x2a0);
                                                if ((uVar1 & 3) == 0) {
                                                  pbVar18 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)proto2_unittest::TestAllTypesLite::Impl_::
                                                                                                        
                                                  _i_give_permission_to_break_this_code_default_default_bytes_
                                                  ._32_8_;
                                                  if (proto2_unittest::TestAllTypesLite::Impl_::
                                                                                                            
                                                  _i_give_permission_to_break_this_code_default_default_bytes_
                                                  ._32_8_ == 0) {
                                                    pbVar18 = internal::LazyString::Init_abi_cxx11_
                                                                        ((LazyString *)
                                                                         proto2_unittest::
                                                                         TestAllTypesLite::Impl_::
                                                                                                                                                  
                                                  _i_give_permission_to_break_this_code_default_default_bytes_
                                                  );
                                                  }
                                                }
                                                else {
                                                  pbVar18 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(uVar1 & 0xfffffffffffffffc);
                                                }
                                                testing::internal::
                                                CmpHelperEQ<char[4],std::__cxx11::string>
                                                          ((internal *)local_f8,"\"416\"",
                                                           "message.default_bytes()",
                                                           (char (*) [4])"416",pbVar18);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x167,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ =
                                                     (message->field_0)._impl_.default_nested_enum_;
                                                testing::internal::
                                                CmpHelperEQ<proto2_unittest::TestAllTypesLite_NestedEnum,proto2_unittest::TestAllTypesLite_NestedEnum>
                                                          ((internal *)local_f8,
                                                           "unittest::TestAllTypesLite::FOO",
                                                           "message.default_nested_enum()",
                                                           &proto2_unittest::TestAllTypesLite::FOO,
                                                           (TestAllTypesLite_NestedEnum *)&local_108
                                                          );
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x169,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ = 4;
                                                local_110.data_._0_4_ =
                                                     (float)(message->field_0)._impl_.
                                                            default_foreign_enum_;
                                                testing::internal::
                                                CmpHelperEQ<proto2_unittest::ForeignEnumLite,proto2_unittest::ForeignEnumLite>
                                                          ((internal *)local_f8,
                                                           "unittest::FOREIGN_LITE_FOO",
                                                           "message.default_foreign_enum()",
                                                           (ForeignEnumLite *)&local_108,
                                                           (ForeignEnumLite *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x16a,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                local_108._M_head_impl._0_4_ = 7;
                                                local_110.data_._0_4_ =
                                                     (float)(message->field_0)._impl_.
                                                            default_import_enum_;
                                                testing::internal::
                                                CmpHelperEQ<proto2_unittest_import::ImportEnumLite,proto2_unittest_import::ImportEnumLite>
                                                          ((internal *)local_f8,
                                                           "unittest_import::IMPORT_LITE_FOO",
                                                           "message.default_import_enum()",
                                                           (ImportEnumLite *)&local_108,
                                                           (ImportEnumLite *)&local_110);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x16b,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                bVar20 = (message->field_0)._impl_._oneof_case_[0]
                                                         != 0x6f;
                                                local_108._M_head_impl._0_1_ = bVar20;
                                                local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                if (!bVar20) {
                                                  testing::Message::Message((Message *)&local_110);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)local_f8,
                                                             (internal *)&local_108,
                                                             (AssertionResult *)
                                                             "message.has_oneof_uint32()","true",
                                                             "false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_d8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x16e,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                }
                                                if (local_100 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_100,local_100);
                                                }
                                                bVar20 = (message->field_0)._impl_._oneof_case_[0]
                                                         != 0x70;
                                                local_108._M_head_impl._0_1_ = bVar20;
                                                local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                if (!bVar20) {
                                                  testing::Message::Message((Message *)&local_110);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)local_f8,
                                                             (internal *)&local_108,
                                                             (AssertionResult *)
                                                             "message.has_oneof_nested_message()",
                                                             "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_d8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x16f,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                }
                                                if (local_100 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_100,local_100);
                                                }
                                                bVar20 = (message->field_0)._impl_._oneof_case_[0]
                                                         != 0x71;
                                                local_108._M_head_impl._0_1_ = bVar20;
                                                local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                if (!bVar20) {
                                                  testing::Message::Message((Message *)&local_110);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)local_f8,
                                                             (internal *)&local_108,
                                                             (AssertionResult *)
                                                             "message.has_oneof_string()","true",
                                                             "false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_d8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x170,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                }
                                                if (local_100 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_100,local_100);
                                                }
                                                bVar20 = (message->field_0)._impl_._oneof_case_[0]
                                                         == 0x72;
                                                local_108._M_head_impl._0_1_ = bVar20;
                                                local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                if (!bVar20) {
                                                  testing::Message::Message((Message *)&local_110);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)local_f8,
                                                             (internal *)&local_108,
                                                             (AssertionResult *)
                                                             "message.has_oneof_bytes()","false",
                                                             "true",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_d8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x171,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                }
                                                if (local_100 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_100,local_100);
                                                }
                                                if ((message->field_0)._impl_._oneof_case_[0] ==
                                                    0x72) {
                                                  pbVar18 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((ulong)(message->field_0)._impl_.oneof_field_.
                                                            oneof_nested_message_ &
                                                    0xfffffffffffffffc);
                                                }
                                                else {
                                                  pbVar18 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&internal::fixed_address_empty_string;
                                                }
                                                testing::internal::
                                                CmpHelperEQ<char[4],std::__cxx11::string>
                                                          ((internal *)local_f8,"\"604\"",
                                                           "message.oneof_bytes()",
                                                           (char (*) [4])"604",pbVar18);
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar19 = "";
                                                  }
                                                  else {
                                                    pcVar19 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x173,pcVar19);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)&local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if (local_108._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_108._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void TestUtilLite::ExpectAllFieldsSet(
    const unittest::TestAllTypesLite& message) {
  EXPECT_TRUE(message.has_optional_int32());
  EXPECT_TRUE(message.has_optional_int64());
  EXPECT_TRUE(message.has_optional_uint32());
  EXPECT_TRUE(message.has_optional_uint64());
  EXPECT_TRUE(message.has_optional_sint32());
  EXPECT_TRUE(message.has_optional_sint64());
  EXPECT_TRUE(message.has_optional_fixed32());
  EXPECT_TRUE(message.has_optional_fixed64());
  EXPECT_TRUE(message.has_optional_sfixed32());
  EXPECT_TRUE(message.has_optional_sfixed64());
  EXPECT_TRUE(message.has_optional_float());
  EXPECT_TRUE(message.has_optional_double());
  EXPECT_TRUE(message.has_optional_bool());
  EXPECT_TRUE(message.has_optional_string());
  EXPECT_TRUE(message.has_optional_bytes());

  EXPECT_TRUE(message.has_optionalgroup());
  EXPECT_TRUE(message.has_optional_nested_message());
  EXPECT_TRUE(message.has_optional_foreign_message());
  EXPECT_TRUE(message.has_optional_import_message());
  EXPECT_TRUE(message.has_optional_public_import_message());
  EXPECT_TRUE(message.has_optional_lazy_message());
  EXPECT_TRUE(message.has_optional_unverified_lazy_message());

  EXPECT_TRUE(message.optionalgroup().has_a());
  EXPECT_TRUE(message.optional_nested_message().has_bb());
  EXPECT_TRUE(message.optional_foreign_message().has_c());
  EXPECT_TRUE(message.optional_import_message().has_d());
  EXPECT_TRUE(message.optional_public_import_message().has_e());
  EXPECT_TRUE(message.optional_lazy_message().has_bb());
  EXPECT_TRUE(message.optional_unverified_lazy_message().has_bb());

  EXPECT_TRUE(message.has_optional_nested_enum());
  EXPECT_TRUE(message.has_optional_foreign_enum());
  EXPECT_TRUE(message.has_optional_import_enum());


  EXPECT_EQ(101, message.optional_int32());
  EXPECT_EQ(102, message.optional_int64());
  EXPECT_EQ(103, message.optional_uint32());
  EXPECT_EQ(104, message.optional_uint64());
  EXPECT_EQ(105, message.optional_sint32());
  EXPECT_EQ(106, message.optional_sint64());
  EXPECT_EQ(107, message.optional_fixed32());
  EXPECT_EQ(108, message.optional_fixed64());
  EXPECT_EQ(109, message.optional_sfixed32());
  EXPECT_EQ(110, message.optional_sfixed64());
  EXPECT_EQ(111, message.optional_float());
  EXPECT_EQ(112, message.optional_double());
  EXPECT_EQ(true, message.optional_bool());
  EXPECT_EQ("115", message.optional_string());
  EXPECT_EQ("116", message.optional_bytes());

  EXPECT_EQ(117, message.optionalgroup().a());
  EXPECT_EQ(118, message.optional_nested_message().bb());
  EXPECT_EQ(119, message.optional_foreign_message().c());
  EXPECT_EQ(120, message.optional_import_message().d());
  EXPECT_EQ(126, message.optional_public_import_message().e());
  EXPECT_EQ(127, message.optional_lazy_message().bb());
  EXPECT_EQ(128, message.optional_unverified_lazy_message().bb());

  EXPECT_EQ(unittest::TestAllTypesLite::BAZ, message.optional_nested_enum());
  EXPECT_EQ(unittest::FOREIGN_LITE_BAZ, message.optional_foreign_enum());
  EXPECT_EQ(unittest_import::IMPORT_LITE_BAZ, message.optional_import_enum());


  // -----------------------------------------------------------------

  ASSERT_EQ(2, message.repeated_int32_size());
  ASSERT_EQ(2, message.repeated_int64_size());
  ASSERT_EQ(2, message.repeated_uint32_size());
  ASSERT_EQ(2, message.repeated_uint64_size());
  ASSERT_EQ(2, message.repeated_sint32_size());
  ASSERT_EQ(2, message.repeated_sint64_size());
  ASSERT_EQ(2, message.repeated_fixed32_size());
  ASSERT_EQ(2, message.repeated_fixed64_size());
  ASSERT_EQ(2, message.repeated_sfixed32_size());
  ASSERT_EQ(2, message.repeated_sfixed64_size());
  ASSERT_EQ(2, message.repeated_float_size());
  ASSERT_EQ(2, message.repeated_double_size());
  ASSERT_EQ(2, message.repeated_bool_size());
  ASSERT_EQ(2, message.repeated_string_size());
  ASSERT_EQ(2, message.repeated_bytes_size());

  ASSERT_EQ(2, message.repeatedgroup_size());
  ASSERT_EQ(2, message.repeated_nested_message_size());
  ASSERT_EQ(2, message.repeated_foreign_message_size());
  ASSERT_EQ(2, message.repeated_import_message_size());
  ASSERT_EQ(2, message.repeated_lazy_message_size());
  ASSERT_EQ(2, message.repeated_nested_enum_size());
  ASSERT_EQ(2, message.repeated_foreign_enum_size());
  ASSERT_EQ(2, message.repeated_import_enum_size());


  EXPECT_EQ(201, message.repeated_int32(0));
  EXPECT_EQ(202, message.repeated_int64(0));
  EXPECT_EQ(203, message.repeated_uint32(0));
  EXPECT_EQ(204, message.repeated_uint64(0));
  EXPECT_EQ(205, message.repeated_sint32(0));
  EXPECT_EQ(206, message.repeated_sint64(0));
  EXPECT_EQ(207, message.repeated_fixed32(0));
  EXPECT_EQ(208, message.repeated_fixed64(0));
  EXPECT_EQ(209, message.repeated_sfixed32(0));
  EXPECT_EQ(210, message.repeated_sfixed64(0));
  EXPECT_EQ(211, message.repeated_float(0));
  EXPECT_EQ(212, message.repeated_double(0));
  EXPECT_EQ(true, message.repeated_bool(0));
  EXPECT_EQ("215", message.repeated_string(0));
  EXPECT_EQ("216", message.repeated_bytes(0));

  EXPECT_EQ(217, message.repeatedgroup(0).a());
  EXPECT_EQ(218, message.repeated_nested_message(0).bb());
  EXPECT_EQ(219, message.repeated_foreign_message(0).c());
  EXPECT_EQ(220, message.repeated_import_message(0).d());
  EXPECT_EQ(227, message.repeated_lazy_message(0).bb());


  EXPECT_EQ(unittest::TestAllTypesLite::BAR, message.repeated_nested_enum(0));
  EXPECT_EQ(unittest::FOREIGN_LITE_BAR, message.repeated_foreign_enum(0));
  EXPECT_EQ(unittest_import::IMPORT_LITE_BAR, message.repeated_import_enum(0));

  EXPECT_EQ(301, message.repeated_int32(1));
  EXPECT_EQ(302, message.repeated_int64(1));
  EXPECT_EQ(303, message.repeated_uint32(1));
  EXPECT_EQ(304, message.repeated_uint64(1));
  EXPECT_EQ(305, message.repeated_sint32(1));
  EXPECT_EQ(306, message.repeated_sint64(1));
  EXPECT_EQ(307, message.repeated_fixed32(1));
  EXPECT_EQ(308, message.repeated_fixed64(1));
  EXPECT_EQ(309, message.repeated_sfixed32(1));
  EXPECT_EQ(310, message.repeated_sfixed64(1));
  EXPECT_EQ(311, message.repeated_float(1));
  EXPECT_EQ(312, message.repeated_double(1));
  // EXPECT_EQ(false, ...) triggers a compiler warning in some platforms.
  //   warning: converting ‘false’ to pointer type
  EXPECT_FALSE(message.repeated_bool(1));
  EXPECT_EQ("315", message.repeated_string(1));
  EXPECT_EQ("316", message.repeated_bytes(1));

  EXPECT_EQ(317, message.repeatedgroup(1).a());
  EXPECT_EQ(318, message.repeated_nested_message(1).bb());
  EXPECT_EQ(319, message.repeated_foreign_message(1).c());
  EXPECT_EQ(320, message.repeated_import_message(1).d());
  EXPECT_EQ(327, message.repeated_lazy_message(1).bb());

  EXPECT_EQ(unittest::TestAllTypesLite::BAZ, message.repeated_nested_enum(1));
  EXPECT_EQ(unittest::FOREIGN_LITE_BAZ, message.repeated_foreign_enum(1));
  EXPECT_EQ(unittest_import::IMPORT_LITE_BAZ, message.repeated_import_enum(1));


  // -----------------------------------------------------------------

  EXPECT_TRUE(message.has_default_int32());
  EXPECT_TRUE(message.has_default_int64());
  EXPECT_TRUE(message.has_default_uint32());
  EXPECT_TRUE(message.has_default_uint64());
  EXPECT_TRUE(message.has_default_sint32());
  EXPECT_TRUE(message.has_default_sint64());
  EXPECT_TRUE(message.has_default_fixed32());
  EXPECT_TRUE(message.has_default_fixed64());
  EXPECT_TRUE(message.has_default_sfixed32());
  EXPECT_TRUE(message.has_default_sfixed64());
  EXPECT_TRUE(message.has_default_float());
  EXPECT_TRUE(message.has_default_double());
  EXPECT_TRUE(message.has_default_bool());
  EXPECT_TRUE(message.has_default_string());
  EXPECT_TRUE(message.has_default_bytes());

  EXPECT_TRUE(message.has_default_nested_enum());
  EXPECT_TRUE(message.has_default_foreign_enum());
  EXPECT_TRUE(message.has_default_import_enum());


  EXPECT_EQ(401, message.default_int32());
  EXPECT_EQ(402, message.default_int64());
  EXPECT_EQ(403, message.default_uint32());
  EXPECT_EQ(404, message.default_uint64());
  EXPECT_EQ(405, message.default_sint32());
  EXPECT_EQ(406, message.default_sint64());
  EXPECT_EQ(407, message.default_fixed32());
  EXPECT_EQ(408, message.default_fixed64());
  EXPECT_EQ(409, message.default_sfixed32());
  EXPECT_EQ(410, message.default_sfixed64());
  EXPECT_EQ(411, message.default_float());
  EXPECT_EQ(412, message.default_double());
  EXPECT_FALSE(message.default_bool());
  EXPECT_EQ("415", message.default_string());
  EXPECT_EQ("416", message.default_bytes());

  EXPECT_EQ(unittest::TestAllTypesLite::FOO, message.default_nested_enum());
  EXPECT_EQ(unittest::FOREIGN_LITE_FOO, message.default_foreign_enum());
  EXPECT_EQ(unittest_import::IMPORT_LITE_FOO, message.default_import_enum());


  EXPECT_FALSE(message.has_oneof_uint32());
  EXPECT_FALSE(message.has_oneof_nested_message());
  EXPECT_FALSE(message.has_oneof_string());
  EXPECT_TRUE(message.has_oneof_bytes());

  EXPECT_EQ("604", message.oneof_bytes());
}